

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::FileDescriptorProto::InternalSwap
          (FileDescriptorProto *this,FileDescriptorProto *other)

{
  uint32 uVar1;
  void *pvVar2;
  string *psVar3;
  FileOptions *pFVar4;
  SourceCodeInfo *pSVar5;
  UnknownFieldSet *other_00;
  
  pvVar2 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar2 & 1) == 0) goto LAB_002aaaff;
LAB_002aaaf2:
    other_00 = (UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar2 & 1) != 0) goto LAB_002aaaf2;
    other_00 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00);
LAB_002aaaff:
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->dependency_).super_RepeatedPtrFieldBase,
             &(other->dependency_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->message_type_).super_RepeatedPtrFieldBase,
             &(other->message_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->enum_type_).super_RepeatedPtrFieldBase,
             &(other->enum_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->service_).super_RepeatedPtrFieldBase,
             &(other->service_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->extension_).super_RepeatedPtrFieldBase,
             &(other->extension_).super_RepeatedPtrFieldBase);
  RepeatedField<int>::InternalSwap(&this->public_dependency_,&other->public_dependency_);
  RepeatedField<int>::InternalSwap(&this->weak_dependency_,&other->weak_dependency_);
  psVar3 = (this->name_).ptr_;
  (this->name_).ptr_ = (other->name_).ptr_;
  (other->name_).ptr_ = psVar3;
  psVar3 = (this->package_).ptr_;
  (this->package_).ptr_ = (other->package_).ptr_;
  (other->package_).ptr_ = psVar3;
  psVar3 = (this->syntax_).ptr_;
  (this->syntax_).ptr_ = (other->syntax_).ptr_;
  (other->syntax_).ptr_ = psVar3;
  pFVar4 = this->options_;
  this->options_ = other->options_;
  other->options_ = pFVar4;
  pSVar5 = this->source_code_info_;
  this->source_code_info_ = other->source_code_info_;
  other->source_code_info_ = pSVar5;
  return;
}

Assistant:

void FileDescriptorProto::InternalSwap(FileDescriptorProto* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  dependency_.InternalSwap(&other->dependency_);
  message_type_.InternalSwap(&other->message_type_);
  enum_type_.InternalSwap(&other->enum_type_);
  service_.InternalSwap(&other->service_);
  extension_.InternalSwap(&other->extension_);
  public_dependency_.InternalSwap(&other->public_dependency_);
  weak_dependency_.InternalSwap(&other->weak_dependency_);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  package_.Swap(&other->package_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  syntax_.Swap(&other->syntax_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  swap(options_, other->options_);
  swap(source_code_info_, other->source_code_info_);
}